

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void sense_trap(trap *trap,xchar x,xchar y,int src_cursed)

{
  boolean bVar1;
  undefined1 local_98 [8];
  trap temp_trap;
  obj obj;
  int src_cursed_local;
  xchar y_local;
  xchar x_local;
  trap *trap_local;
  
  if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
      ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) &&
     (src_cursed == 0)) {
    if (trap == (trap *)0x0) {
      temp_trap.ntrap._0_1_ = (byte)temp_trap.ntrap & 0xe0 | 5;
      temp_trap.ntrap._1_1_ = x;
      temp_trap.ntrap._2_1_ = y;
      map_trap((trap *)local_98,1);
    }
    else {
      map_trap(trap,1);
      trap->field_0x8 = trap->field_0x8 & 0xdf | 0x20;
    }
  }
  else {
    memcpy(&temp_trap.vl,&zeroobj,0x68);
    if (src_cursed == 0) {
      display_rng(0x219);
    }
    display_rng(0x193);
    map_object((obj *)&temp_trap.vl.v_launch2,1);
  }
  return;
}

Assistant:

static void sense_trap(struct trap *trap, xchar x, xchar y, int src_cursed)
{
    if (Hallucination || src_cursed) {
	struct obj obj;			/* fake object */
	obj = zeroobj;
	if (trap) {
	    obj.ox = trap->tx;
	    obj.oy = trap->ty;
	} else {
	    obj.ox = x;
	    obj.oy = y;
	}
	obj.otyp = (src_cursed) ? GOLD_PIECE : random_object();
	obj.corpsenm = random_monster();	/* if otyp == CORPSE */
	map_object(&obj,1);
    } else if (trap) {
	map_trap(trap,1);
	trap->tseen = 1;
    } else {
	struct trap temp_trap;		/* fake trap */
	temp_trap.tx = x;
	temp_trap.ty = y;
	temp_trap.ttyp = BEAR_TRAP;	/* some kind of trap */
	map_trap(&temp_trap, 1);
    }

}